

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_diff.hpp
# Opt level: O1

Diffs * __thiscall
MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
diff_bisect(Diffs *__return_storage_ptr__,
           MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,Range text1,Range text2,Time deadline)

{
  pointer *ppDVar1;
  iterator iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  ConstIter CVar15;
  long lVar16;
  ConstIter CVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  ConstIter CVar27;
  ConstIter CVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  int local_110;
  int local_10c;
  Diff local_b0;
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  
  CVar28 = text2.till._M_current;
  CVar27 = text2.from._M_current;
  CVar15 = text1.till._M_current;
  CVar17 = text1.from._M_current;
  uVar31 = (long)CVar15._M_current - (long)CVar17._M_current;
  uVar32 = (long)CVar28._M_current - (long)CVar27._M_current;
  iVar3 = (int)uVar31;
  iVar4 = (int)uVar32;
  iVar21 = iVar3 + iVar4 + 1;
  uVar6 = ((iVar3 + iVar4) - (iVar21 >> 0x1f)) + 1;
  uVar7 = uVar6 & 0xfffffffe;
  v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&v1,(long)(int)uVar7);
  v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&v2,(long)(int)uVar7);
  uVar6 = (int)uVar6 >> 1;
  uVar9 = (ulong)uVar6;
  if (1 < iVar21) {
    uVar18 = 1;
    if (1 < (int)uVar7) {
      uVar18 = (ulong)uVar7;
    }
    uVar22 = 0;
    do {
      v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar22] = -1;
      v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar22] = -1;
      uVar22 = uVar22 + 1;
    } while (uVar18 != uVar22);
  }
  iVar24 = 0;
  v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [(long)(int)uVar6 + 1] = 0;
  v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [(long)(int)uVar6 + 1] = 0;
  if (1 < iVar21) {
    uVar12 = iVar3 - iVar4;
    uVar18 = 0;
    iVar21 = 0;
    local_10c = 0;
    iVar8 = 0;
    local_110 = 0;
    do {
      iVar25 = (int)uVar18;
      bVar11 = iVar25 - local_10c < iVar21 - iVar25;
      if (iVar21 - iVar25 <= iVar25 - local_10c) {
        iVar33 = iVar25 - iVar21;
        uVar22 = (ulong)(iVar21 + iVar24);
        do {
          lVar10 = uVar9 + uVar22;
          if ((uVar22 == -uVar18) ||
             ((uVar22 != uVar18 &&
              (v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar10 + -1] <
               v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar10 + 1])))) {
            uVar14 = v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar10 + 1];
          }
          else {
            uVar14 = v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar10 + -1] + 1;
          }
          uVar19 = (ulong)uVar14;
          uVar29 = uVar14 - (int)uVar22;
          uVar30 = (ulong)uVar29;
          if (((int)uVar14 < iVar3) && ((int)uVar29 < iVar4)) {
            uVar19 = (ulong)(int)uVar14;
            uVar30 = (ulong)(int)(uVar14 + iVar33);
            while( true ) {
              if ((uVar31 <= uVar19) || (uVar32 <= uVar30)) goto LAB_001026f1;
              if (CVar17._M_current[uVar19] != CVar27._M_current[uVar30]) break;
              uVar19 = uVar19 + 1;
              uVar30 = uVar30 + 1;
              if (((long)iVar3 <= (long)uVar19) || ((long)iVar4 <= (long)uVar30)) break;
            }
          }
          iVar13 = (int)uVar19;
          v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [lVar10] = iVar13;
          if (iVar3 < iVar13) {
            local_10c = local_10c + 2;
LAB_00102334:
            bVar5 = true;
          }
          else {
            if (iVar4 < (int)uVar30) {
              iVar21 = iVar21 + 2;
              goto LAB_00102334;
            }
            bVar5 = true;
            if (((((uVar12 & 1) != 0) && (uVar14 = (uVar12 + uVar6) - (int)uVar22, uVar14 < uVar7))
                && (v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_start[uVar14] != -1)) &&
               (iVar3 - v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar14] <= iVar13)) {
              diff_bisectSplit(__return_storage_ptr__,this,text1,text2,iVar13,(int)uVar30,deadline);
              bVar5 = false;
            }
          }
          if (!bVar5) break;
          uVar22 = uVar22 + 2;
          iVar33 = iVar33 + -2;
          bVar11 = (long)(uVar18 - (long)local_10c) < (long)uVar22;
        } while ((long)uVar22 <= (long)(uVar18 - (long)local_10c));
      }
      if (!bVar11) goto LAB_001026ad;
      bVar11 = iVar25 - local_110 < iVar8 - iVar25;
      if (iVar8 - iVar25 <= iVar25 - local_110) {
        iVar25 = iVar25 - iVar8;
        uVar22 = (ulong)(iVar24 + iVar8);
        do {
          lVar10 = uVar9 + uVar22;
          if ((uVar22 == -uVar18) ||
             ((uVar22 != uVar18 &&
              (v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar10 + -1] <
               v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar10 + 1])))) {
            iVar33 = v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar10 + 1];
          }
          else {
            iVar33 = v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar10 + -1] + 1;
          }
          iVar13 = iVar33 - (int)uVar22;
          if ((iVar33 < iVar3) && (iVar13 < iVar4)) {
            lVar16 = (long)(iVar33 + iVar25);
            lVar20 = (long)iVar33;
            lVar23 = (ulong)((~(uint)text1.from._M_current + (int)text1.till._M_current) - iVar33)
                     << 0x20;
            lVar26 = (ulong)((~(uint)text2.from._M_current + (int)text2.till._M_current) -
                            (iVar33 + iVar25)) << 0x20;
            do {
              if ((uVar31 <= (ulong)(lVar23 >> 0x20)) || (uVar32 <= (ulong)(lVar26 >> 0x20))) {
LAB_001026f1:
                __assert_fail("idx < size()",
                              "/workspace/llm4binary/github/license_c_cmakelists/gritzko[P]myers-diff/dmp_diff.hpp"
                              ,0x76,
                              "Char MyersDiff<std::basic_string<char>>::Range::operator[](Size) const [String = std::basic_string<char>]"
                             );
              }
              if (CVar17._M_current[lVar23 >> 0x20] != CVar27._M_current[lVar26 >> 0x20]) break;
              lVar20 = lVar20 + 1;
              lVar16 = lVar16 + 1;
              if (iVar3 <= lVar20) break;
              lVar23 = lVar23 + -0x100000000;
              lVar26 = lVar26 + -0x100000000;
            } while (lVar16 < iVar4);
            iVar13 = (int)lVar16;
            iVar33 = (int)lVar20;
          }
          v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [lVar10] = iVar33;
          if (iVar3 < iVar33) {
            local_110 = local_110 + 2;
LAB_00102545:
            bVar5 = true;
          }
          else {
            if (iVar4 < iVar13) {
              iVar8 = iVar8 + 2;
              goto LAB_00102545;
            }
            bVar5 = true;
            if (((((uVar12 & 1) == 0) && (uVar14 = (uVar12 + uVar6) - (int)uVar22, uVar14 < uVar7))
                && (iVar13 = v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar14], bVar5 = true, iVar13 != -1))
               && (iVar3 - iVar33 <= iVar13)) {
              diff_bisectSplit(__return_storage_ptr__,this,text1,text2,iVar13,
                               (uVar6 - uVar14) + iVar13,deadline);
              bVar5 = false;
            }
          }
          if (!bVar5) break;
          uVar22 = uVar22 + 2;
          iVar25 = iVar25 + -2;
          bVar11 = (long)(uVar18 - (long)local_110) < (long)uVar22;
        } while ((long)uVar22 <= (long)(uVar18 - (long)local_110));
      }
      if (!bVar11) goto LAB_001026ad;
      uVar18 = uVar18 + 1;
      iVar24 = iVar24 + -1;
    } while (uVar18 != uVar9);
  }
  (__return_storage_ptr__->
  super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0.operation = DELETE;
  iVar2._M_current =
       (__return_storage_ptr__->
       super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_b0.text.from._M_current = CVar17._M_current;
    local_b0.text.till._M_current = CVar15._M_current;
    std::
    vector<MyersDiff<std::__cxx11::string>::Diff,std::allocator<MyersDiff<std::__cxx11::string>::Diff>>
    ::_M_realloc_insert<MyersDiff<std::__cxx11::string>::Diff>
              ((vector<MyersDiff<std::__cxx11::string>::Diff,std::allocator<MyersDiff<std::__cxx11::string>::Diff>>
                *)__return_storage_ptr__,iVar2,&local_b0);
  }
  else {
    ((iVar2._M_current)->text).till._M_current = CVar15._M_current;
    *(ulong *)iVar2._M_current = CONCAT71(local_b0._1_7_,2);
    ((iVar2._M_current)->text).from._M_current = CVar17._M_current;
    ppDVar1 = &(__return_storage_ptr__->
               super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppDVar1 = *ppDVar1 + 1;
  }
  local_b0.operation = INSERT;
  iVar2._M_current =
       (__return_storage_ptr__->
       super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_b0.text.from._M_current = CVar27._M_current;
  local_b0.text.till._M_current = CVar28._M_current;
  if (iVar2._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<MyersDiff<std::__cxx11::string>::Diff,std::allocator<MyersDiff<std::__cxx11::string>::Diff>>
    ::_M_realloc_insert<MyersDiff<std::__cxx11::string>::Diff>
              ((vector<MyersDiff<std::__cxx11::string>::Diff,std::allocator<MyersDiff<std::__cxx11::string>::Diff>>
                *)__return_storage_ptr__,iVar2,&local_b0);
  }
  else {
    ((iVar2._M_current)->text).till._M_current = CVar28._M_current;
    *(ulong *)iVar2._M_current = CONCAT71(local_b0._1_7_,1);
    ((iVar2._M_current)->text).from._M_current = CVar27._M_current;
    ppDVar1 = &(__return_storage_ptr__->
               super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppDVar1 = *ppDVar1 + 1;
  }
LAB_001026ad:
  if (v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_start);
  }
  if (v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Diffs diff_bisect(Range text1, Range text2, Time deadline) {
        // Cache the text lengths to prevent multiple calls.
        int text1_length = text1.size();
        int text2_length = text2.size();
        int max_d = (text1_length + text2_length + 1) / 2;
        int v_offset = max_d;
        int v_length = 2 * max_d;
        vector<int> v1;
        v1.resize(v_length);
        vector<int> v2;
        v2.resize(v_length);
        for (int x = 0; x < v_length; x++) {
            v1[x] = -1;
            v2[x] = -1;
        }
        v1[v_offset + 1] = 0;
        v2[v_offset + 1] = 0;
        int delta = text1_length - text2_length;
        // If the total number of characters is odd, then the front path will
        // collide with the reverse path.
        bool front = (delta % 2 != 0);
        // Offsets for start and end of k loop.
        // Prevents mapping of space beyond the grid.
        int k1start = 0;
        int k1end = 0;
        int k2start = 0;
        int k2end = 0;
        for (int d = 0; d < max_d; d++) {
            // Bail out if deadline is reached.
            /* TODO if (System.currentTimeMillis() > deadline) {
              break;
            } */

            // Walk the front path one step.
            for (int k1 = -d + k1start; k1 <= d - k1end; k1 += 2) {
                int k1_offset = v_offset + k1;
                int x1;
                if (k1 == -d ||
                    (k1 != d && v1[k1_offset - 1] < v1[k1_offset + 1])) {
                    x1 = v1[k1_offset + 1];
                } else {
                    x1 = v1[k1_offset - 1] + 1;
                }
                int y1 = x1 - k1;
                while (x1 < text1_length && y1 < text2_length &&
                       text1[x1] == text2[y1]) {
                    x1++;
                    y1++;
                }
                v1[k1_offset] = x1;
                if (x1 > text1_length) {
                    // Ran off the right of the graph.
                    k1end += 2;
                } else if (y1 > text2_length) {
                    // Ran off the bottom of the graph.
                    k1start += 2;
                } else if (front) {
                    int k2_offset = v_offset + delta - k1;
                    if (k2_offset >= 0 && k2_offset < v_length &&
                        v2[k2_offset] != -1) {
                        // Mirror x2 onto top-left coordinate system.
                        int x2 = text1_length - v2[k2_offset];
                        if (x1 >= x2) {
                            // Overlap detected.
                            return diff_bisectSplit(text1, text2, x1, y1,
                                                    deadline);
                        }
                    }
                }
            }

            // Walk the reverse path one step.
            for (int k2 = -d + k2start; k2 <= d - k2end; k2 += 2) {
                int k2_offset = v_offset + k2;
                int x2;
                if (k2 == -d ||
                    (k2 != d && v2[k2_offset - 1] < v2[k2_offset + 1])) {
                    x2 = v2[k2_offset + 1];
                } else {
                    x2 = v2[k2_offset - 1] + 1;
                }
                int y2 = x2 - k2;
                while (x2 < text1_length && y2 < text2_length &&
                       text1[text1_length - x2 - 1] ==
                           text2[text2_length - y2 - 1]) {
                    x2++;
                    y2++;
                }
                v2[k2_offset] = x2;
                if (x2 > text1_length) {
                    // Ran off the left of the graph.
                    k2end += 2;
                } else if (y2 > text2_length) {
                    // Ran off the top of the graph.
                    k2start += 2;
                } else if (!front) {
                    int k1_offset = v_offset + delta - k2;
                    if (k1_offset >= 0 && k1_offset < v_length &&
                        v1[k1_offset] != -1) {
                        int x1 = v1[k1_offset];
                        int y1 = v_offset + x1 - k1_offset;
                        // Mirror x2 onto top-left coordinate system.
                        x2 = text1_length - x2;
                        if (x1 >= x2) {
                            // Overlap detected.
                            return diff_bisectSplit(text1, text2, x1, y1,
                                                    deadline);
                        }
                    }
                }
            }
        }
        // Diff took too long and hit the deadline or
        // number of diffs equals number of characters, no commonality at all.
        Diffs diffs{};
        diffs.push_back(Diff{DELETE, text1});
        diffs.push_back(Diff{INSERT, text2});
        return diffs;
    }